

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O3

void HighsHashTree<int,_int>::mergeIntoLeaf<2>(InnerLeaf<2> *leaf,int hashPos,NodePtr mergeNode)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  
  switch((uint)mergeNode.ptrAndType & 7) {
  case 1:
    puVar2 = (undefined8 *)(mergeNode.ptrAndType & 0xfffffffffffffff8);
    InnerLeaf<2>::insert_entry
              (leaf,(ulong)*(uint *)(puVar2 + 1) * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20
                    ^ (ulong)*(uint *)(puVar2 + 1) * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32,
               hashPos,(Entry *)(puVar2 + 1));
    puVar2 = (undefined8 *)*puVar2;
    while (puVar2 != (undefined8 *)0x0) {
      puVar1 = (undefined8 *)*puVar2;
      InnerLeaf<2>::insert_entry
                (leaf,(ulong)*(uint *)(puVar2 + 1) * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >>
                      0x20 ^ (ulong)*(uint *)(puVar2 + 1) * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32
                 ,hashPos,(Entry *)(puVar2 + 1));
      operator_delete(puVar2);
      puVar2 = puVar1;
    }
    return;
  case 2:
    HighsHashTree<int,int>::mergeIntoLeaf<2,1>
              (leaf,(InnerLeaf<1> *)(mergeNode.ptrAndType & 0xfffffffffffffff8),hashPos);
    break;
  case 3:
    HighsHashTree<int,int>::mergeIntoLeaf<2,2>
              (leaf,(InnerLeaf<2> *)(mergeNode.ptrAndType & 0xfffffffffffffff8),hashPos);
    break;
  case 4:
    HighsHashTree<int,int>::mergeIntoLeaf<2,3>
              (leaf,(InnerLeaf<3> *)(mergeNode.ptrAndType & 0xfffffffffffffff8),hashPos);
    break;
  case 5:
    HighsHashTree<int,int>::mergeIntoLeaf<2,4>
              (leaf,(InnerLeaf<4> *)(mergeNode.ptrAndType & 0xfffffffffffffff8),hashPos);
    break;
  default:
    return;
  }
  operator_delete((void *)(mergeNode.ptrAndType & 0xfffffffffffffff8));
  return;
}

Assistant:

static void mergeIntoLeaf(InnerLeaf<SizeClass>* leaf, int hashPos,
                            NodePtr mergeNode) {
    switch (mergeNode.getType()) {
      case kListLeaf: {
        ListLeaf* mergeLeaf = mergeNode.getListLeaf();
        leaf->insert_entry(compute_hash(mergeLeaf->first.entry.key()), hashPos,
                           mergeLeaf->first.entry);
        ListNode* iter = mergeLeaf->first.next;
        while (iter != nullptr) {
          ListNode* next = iter->next;
          leaf->insert_entry(compute_hash(iter->entry.key()), hashPos,
                             iter->entry);
          delete iter;
          iter = next;
        }
        break;
      }
      case kInnerLeafSizeClass1:
        mergeIntoLeaf(leaf, mergeNode.getInnerLeafSizeClass1(), hashPos);
        delete mergeNode.getInnerLeafSizeClass1();
        break;
      case kInnerLeafSizeClass2:
        mergeIntoLeaf(leaf, mergeNode.getInnerLeafSizeClass2(), hashPos);
        delete mergeNode.getInnerLeafSizeClass2();
        break;
      case kInnerLeafSizeClass3:
        mergeIntoLeaf(leaf, mergeNode.getInnerLeafSizeClass3(), hashPos);
        delete mergeNode.getInnerLeafSizeClass3();
        break;
      case kInnerLeafSizeClass4:
        mergeIntoLeaf(leaf, mergeNode.getInnerLeafSizeClass4(), hashPos);
        delete mergeNode.getInnerLeafSizeClass4();
        break;
      default:
        break;
    }
  }